

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_identifier_expression(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gnode_t *local_60;
  undefined1 auStack_50 [8];
  gtoken_s token;
  char *identifier;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token.value = parse_identifier(parser);
  if (token.value == (char *)0x0) {
    parser_local = (gravity_parser_t *)0x0;
  }
  else {
    gravity_lexer_token((gtoken_s *)auStack_50,lexer_00);
    if (parser->declarations->n == 0) {
      local_60 = (gnode_t *)0x0;
    }
    else {
      local_60 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_00.colno = token.type;
    token_00.position = token.lineno;
    token_00.type = auStack_50._0_4_;
    token_00.lineno = auStack_50._4_4_;
    token_00.bytes = token.colno;
    token_00.length = token.position;
    token_00.fileid = token.bytes;
    token_00.builtin = token.length;
    token_00.value = (char *)token._24_8_;
    parser_local = (gravity_parser_t *)
                   gnode_identifier_expr_create(token_00,token.value,(char *)0x0,local_60);
  }
  return (gnode_t *)parser_local;
}

Assistant:

static gnode_t *parse_identifier_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_identifier_expression");
    DECLARE_LEXER;

    const char *identifier = parse_identifier(parser);
    if (!identifier) return NULL;
    DEBUG_PARSER("IDENTIFIER: %s", identifier);

    gtoken_s token = gravity_lexer_token(lexer);
    return gnode_identifier_expr_create(token, identifier, NULL, LAST_DECLARATION());
}